

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hdr.h
# Opt level: O0

void __thiscall
gimage::HighDynamicRangeFusion<unsigned_short>::mulWellExposednessWeight
          (HighDynamicRangeFusion<unsigned_short> *this,ImageFloat *wp,
          Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_> *image,float max_value)

{
  int iVar1;
  long lVar2;
  int iVar3;
  long lVar4;
  unsigned_short *puVar5;
  size_type sVar6;
  reference pvVar7;
  Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_> *in_RDX;
  Image<float,_gimage::PixelTraits<float>_> *in_RSI;
  ulong uVar8;
  vector<float,_std::allocator<float>_> *in_RDI;
  float in_XMM0_Da;
  unsigned_short pv;
  int d;
  float v;
  long i;
  long k;
  float *p;
  float local_68;
  store_t_conflict1 local_48;
  unsigned_short local_46 [2];
  ushort local_42;
  int local_40;
  float local_3c;
  long local_38;
  long local_30;
  float *local_28;
  float local_1c;
  Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_> *local_18;
  
  local_1c = in_XMM0_Da;
  local_18 = in_RDX;
  local_28 = Image<float,_gimage::PixelTraits<float>_>::getPtr(in_RSI,0,0,0);
  for (local_30 = 0; lVar2 = local_30,
      lVar4 = Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_>::getHeight(local_18),
      lVar2 < lVar4; local_30 = local_30 + 1) {
    for (local_38 = 0; lVar2 = local_38,
        lVar4 = Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_>::getWidth(local_18),
        lVar2 < lVar4; local_38 = local_38 + 1) {
      local_3c = 1.0;
      for (local_40 = 0; iVar1 = local_40,
          iVar3 = Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_>::getDepth(local_18),
          iVar1 < iVar3; local_40 = local_40 + 1) {
        local_46[1] = 0;
        local_46[0] = (unsigned_short)(int)local_1c;
        local_48 = Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_>::get
                             (local_18,local_38,local_30,local_40);
        puVar5 = std::min<unsigned_short>(local_46,&local_48);
        puVar5 = std::max<unsigned_short>(local_46 + 1,puVar5);
        local_42 = *puVar5;
        sVar6 = std::vector<float,_std::allocator<float>_>::size(in_RDI);
        local_68 = (float)(sVar6 * local_42);
        uVar8 = (ulong)(local_68 / local_1c);
        pvVar7 = std::vector<float,_std::allocator<float>_>::operator[]
                           (in_RDI,uVar8 | (long)(local_68 / local_1c - 9.223372e+18) &
                                           (long)uVar8 >> 0x3f);
        local_3c = *pvVar7 * local_3c;
      }
      *local_28 = local_3c * *local_28;
      local_28 = local_28 + 1;
    }
  }
  return;
}

Assistant:

void mulWellExposednessWeight(ImageFloat &wp, const Image<T> &image, float max_value)
    {
      float *p=wp.getPtr(0, 0, 0);
      for (long k=0; k<image.getHeight(); k++)
      {
        for (long i=0; i<image.getWidth(); i++)
        {
          float v=1;
          for (int d=0; d<image.getDepth(); d++)
          {
            T pv=std::max(static_cast<T>(0), std::min(static_cast<T>(max_value),
              image.get(i, k, d)));

            v*=gauss[static_cast<size_t>(gauss.size()*pv/max_value)];
          }

          // multiply distance from center intensity, weighted by Gauss

          *p++ *= v;
        }
      }
    }